

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::OP_HasItem(Var instance,Var index,ScriptContext *scriptContext)

{
  code *pcVar1;
  DynamicObject *pDVar2;
  bool bVar3;
  PropertyId PVar4;
  BOOL BVar5;
  JavascriptLibrary *this;
  undefined4 *puVar6;
  DynamicObject *local_60;
  PropertyRecord *local_58;
  PropertyRecord *debugPropertyRecord;
  JavascriptString *indexStr;
  PropertyRecord *pPStack_40;
  IndexType indexType;
  PropertyRecord *propertyRecord;
  DynamicObject *pDStack_30;
  uint32 indexVal;
  RecyclableObject *object;
  ScriptContext *scriptContext_local;
  Var index_local;
  Var instance_local;
  
  object = (RecyclableObject *)scriptContext;
  scriptContext_local = (ScriptContext *)index;
  index_local = instance;
  bVar3 = TaggedNumber::Is(instance);
  if (bVar3) {
    this = ScriptContext::GetLibrary((ScriptContext *)object);
    local_60 = JavascriptLibraryBase::GetNumberPrototype(&this->super_JavascriptLibraryBase);
  }
  else {
    local_60 = (DynamicObject *)VarTo<Js::RecyclableObject>(index_local);
  }
  pDStack_30 = local_60;
  pPStack_40 = (PropertyRecord *)0x0;
  indexStr._4_4_ =
       GetIndexType(&scriptContext_local,(ScriptContext *)object,
                    (uint32 *)((long)&propertyRecord + 4),&stack0xffffffffffffffc0,false);
  if (indexStr._4_4_ == IndexType_Number) {
    instance_local._4_4_ = HasItem(&pDStack_30->super_RecyclableObject,propertyRecord._4_4_);
  }
  else {
    if (indexStr._4_4_ != IndexType_PropertyId) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0xde0,"(indexType == IndexType_PropertyId)",
                                  "indexType == IndexType_PropertyId");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if ((pPStack_40 == (PropertyRecord *)0x0) &&
       (bVar3 = CanShortcutOnUnknownPropertyName(&pDStack_30->super_RecyclableObject), !bVar3)) {
      indexStr._4_4_ =
           GetIndexTypeFromPrimitive
                     (scriptContext_local,(ScriptContext *)object,
                      (uint32 *)((long)&propertyRecord + 4),&stack0xffffffffffffffc0,true);
      if (indexStr._4_4_ != IndexType_PropertyId) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xde4,"(indexType == IndexType_PropertyId)",
                                    "indexType == IndexType_PropertyId");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      if (pPStack_40 == (PropertyRecord *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xde5,"(propertyRecord != nullptr)","propertyRecord != nullptr"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
    pDVar2 = pDStack_30;
    if (pPStack_40 == (PropertyRecord *)0x0) {
      debugPropertyRecord =
           (PropertyRecord *)
           JavascriptConversion::ToString(scriptContext_local,(ScriptContext *)object);
      ScriptContext::GetOrAddPropertyRecord
                ((ScriptContext *)object,(JavascriptString *)debugPropertyRecord,&local_58);
      pDVar2 = pDStack_30;
      PVar4 = PropertyRecord::GetPropertyId(local_58);
      BVar5 = HasProperty(&pDVar2->super_RecyclableObject,PVar4);
      if (BVar5 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xdf2,
                                    "(!JavascriptOperators::HasProperty(object, debugPropertyRecord->GetPropertyId()))"
                                    ,
                                    "how did this property come? See OS Bug 2727708 if you see this come from the web"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      instance_local._4_4_ = 0;
    }
    else {
      PVar4 = PropertyRecord::GetPropertyId(pPStack_40);
      instance_local._4_4_ = HasProperty(&pDVar2->super_RecyclableObject,PVar4);
    }
  }
  return instance_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::OP_HasItem(Var instance, Var index, ScriptContext* scriptContext)
    {
        RecyclableObject* object = TaggedNumber::Is(instance) ?
            scriptContext->GetLibrary()->GetNumberPrototype() :
            VarTo<RecyclableObject>(instance);

        uint32 indexVal;
        PropertyRecord const * propertyRecord = nullptr;
        IndexType indexType = GetIndexType(index, scriptContext, &indexVal, &propertyRecord, false);

        if (indexType == IndexType_Number)
        {
            return HasItem(object, indexVal);
        }
        else
        {
            Assert(indexType == IndexType_PropertyId);
            if (propertyRecord == nullptr && !JavascriptOperators::CanShortcutOnUnknownPropertyName(object))
            {
                indexType = GetIndexTypeFromPrimitive(index, scriptContext, &indexVal, &propertyRecord, true);
                Assert(indexType == IndexType_PropertyId);
                Assert(propertyRecord != nullptr);
            }

            if (propertyRecord != nullptr)
            {
                return HasProperty(object, propertyRecord->GetPropertyId());
            }
            else
            {
#if DBG
                JavascriptString* indexStr = JavascriptConversion::ToString(index, scriptContext);
                PropertyRecord const * debugPropertyRecord;
                scriptContext->GetOrAddPropertyRecord(indexStr, &debugPropertyRecord);
                AssertMsg(!JavascriptOperators::HasProperty(object, debugPropertyRecord->GetPropertyId()), "how did this property come? See OS Bug 2727708 if you see this come from the web");
#endif

                return FALSE;
            }
        }
    }